

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::anon_unknown_0::CommonFunctionCase::~CommonFunctionCase
          (CommonFunctionCase *this)

{
  code *pcVar1;
  CommonFunctionCase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

CommonFunctionCase::~CommonFunctionCase (void)
{
}